

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

position_type __thiscall
io::posix::file::seek(file *this,offset_type offset,seek_mode from,error_code *ec)

{
  int *piVar1;
  __off_t from_start;
  error_category *peVar2;
  int iVar3;
  stream_position<long> local_30;
  
  std::error_code::clear(ec);
  piVar1 = __errno_location();
  *piVar1 = 0;
  if (from < (current|end)) {
    iVar3 = *(int *)(&DAT_00109354 + (ulong)from * 4);
  }
  else {
    iVar3 = -1;
  }
  from_start = lseek((this->fd_).fd_,offset,iVar3);
  if (from_start < 0) {
    iVar3 = *piVar1;
    peVar2 = (error_category *)std::_V2::system_category();
    ec->_M_value = iVar3;
    ec->_M_cat = peVar2;
    local_30.pos_ = 0;
  }
  else {
    stream_position<long>::stream_position(&local_30,from_start);
  }
  return (position_type)local_30.pos_;
}

Assistant:

position_type
    seek(offset_type offset, seek_mode from, std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;
        auto o = ::lseek(native_handle(), static_cast<off_t>(offset),
                         detail::seek_mode_to_whence_arg(from));

        if (o < 0) {
            ec.assign(errno, std::system_category());
            return position_type{};
        }

        return position_type{o};
    }